

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.cpp
# Opt level: O0

void DeleteAt(LinkedList *L)

{
  ostream *this;
  Node *local_18;
  Node *oldNode;
  LinkedList *L_local;
  
  if (L->currPtr == (Node *)0x0) {
    this = std::operator<<((ostream *)&std::cout,"DeleteAt: current position is invalid!");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    if (L->prevPtr == (Node *)0x0) {
      local_18 = L->front;
      L->front = L->currPtr->next;
    }
    else {
      local_18 = DeleteAfter(L->prevPtr);
    }
    if (local_18 == L->rear) {
      L->rear = L->prevPtr;
    }
    L->currPtr = local_18->next;
    FreeNode(local_18);
    L->size = L->size + -1;
  }
  return;
}

Assistant:

void DeleteAt(LinkedList *L) { //链表中删除当前结点的函数
    Node *oldNode;
    if(!L->currPtr) {   //若表为空或已到表尾，则给出错误提示并返回
        cout << "DeleteAt: current position is invalid!" << endl;
        return ;
    }
    if(!L->prevPtr) {   //若删除的是表头结点
        oldNode = L->front;
        L->front = (L->currPtr)->next;
    } else {   //若删除的是表中结点
        oldNode = DeleteAfter(L->prevPtr);
    }
    if(oldNode == L->rear) {  //若删除的是表未结点，则修改表尾指针
        L->rear = L->prevPtr;
    }
    L->currPtr = oldNode->next;   //新插入的结点作为当前结点
    FreeNode(oldNode);   //释放原当前结点
    L->size--;   //修改链表的大小
}